

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISceneNode.h
# Opt level: O1

matrix4 * __thiscall
irr::scene::ISceneNode::getRelativeTransformation(matrix4 *__return_storage_ptr__,ISceneNode *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  __return_storage_ptr__->M[0xc] = 0.0;
  __return_storage_ptr__->M[0xd] = 0.0;
  __return_storage_ptr__->M[0xe] = 0.0;
  __return_storage_ptr__->M[0xf] = 0.0;
  __return_storage_ptr__->M[8] = 0.0;
  __return_storage_ptr__->M[9] = 0.0;
  __return_storage_ptr__->M[10] = 0.0;
  __return_storage_ptr__->M[0xb] = 0.0;
  __return_storage_ptr__->M[4] = 0.0;
  __return_storage_ptr__->M[5] = 0.0;
  __return_storage_ptr__->M[6] = 0.0;
  __return_storage_ptr__->M[7] = 0.0;
  __return_storage_ptr__->M[0] = 0.0;
  __return_storage_ptr__->M[1] = 0.0;
  __return_storage_ptr__->M[2] = 0.0;
  __return_storage_ptr__->M[3] = 0.0;
  __return_storage_ptr__->M[0xf] = 1.0;
  __return_storage_ptr__->M[10] = 1.0;
  __return_storage_ptr__->M[5] = 1.0;
  __return_storage_ptr__->M[0] = 1.0;
  fVar1 = (this->RelativeRotation).Y;
  fVar2 = (this->RelativeRotation).Z;
  dVar8 = (double)((this->RelativeRotation).X * 0.017453292);
  dVar9 = cos(dVar8);
  dVar8 = sin(dVar8);
  dVar10 = (double)(fVar1 * 0.017453292);
  dVar11 = cos(dVar10);
  dVar10 = sin(dVar10);
  dVar12 = (double)(fVar2 * 0.017453292);
  dVar13 = cos(dVar12);
  dVar12 = sin(dVar12);
  fVar26 = -(float)dVar10;
  __return_storage_ptr__->M[2] = fVar26;
  fVar23 = (float)(dVar8 * dVar10 * dVar13 + -dVar9 * dVar12);
  fVar24 = (float)(dVar8 * dVar10 * dVar12 + dVar13 * dVar9);
  *(ulong *)(__return_storage_ptr__->M + 4) = CONCAT44(fVar24,fVar23);
  fVar25 = (float)(dVar8 * dVar11);
  __return_storage_ptr__->M[6] = fVar25;
  fVar16 = (float)(dVar9 * dVar11);
  __return_storage_ptr__->M[10] = fVar16;
  fVar20 = (float)(dVar11 * dVar13);
  fVar21 = (float)(dVar11 * dVar12);
  *(ulong *)__return_storage_ptr__->M = CONCAT44(fVar21,fVar20);
  fVar17 = (float)(dVar10 * dVar9 * dVar13 + dVar12 * dVar8);
  fVar18 = (float)(dVar10 * dVar9 * dVar12 + -dVar8 * dVar13);
  *(ulong *)(__return_storage_ptr__->M + 8) = CONCAT44(fVar18,fVar17);
  uVar7._0_4_ = (this->RelativeTranslation).X;
  uVar7._4_4_ = (this->RelativeTranslation).Y;
  *(undefined8 *)(__return_storage_ptr__->M + 0xc) = uVar7;
  fVar1 = (this->RelativeTranslation).Z;
  __return_storage_ptr__->M[0xe] = fVar1;
  fVar2 = (this->RelativeScale).X;
  if ((((fVar2 != 1.0) || (NAN(fVar2))) || (fVar19 = (this->RelativeScale).Y, fVar19 != 1.0)) ||
     (((NAN(fVar19) || (fVar19 = (this->RelativeScale).Z, fVar19 != 1.0)) || (NAN(fVar19))))) {
    fVar19 = (this->RelativeScale).Y;
    fVar3 = (this->RelativeScale).Z;
    fVar4 = __return_storage_ptr__->M[3];
    fVar14 = (float)(undefined4)uVar7 * 0.0;
    fVar15 = (float)uVar7._4_4_ * 0.0;
    fVar22 = __return_storage_ptr__->M[7];
    fVar5 = __return_storage_ptr__->M[0xb];
    fVar6 = (this->RelativeScale).Z;
    *(ulong *)(__return_storage_ptr__->M + 4) =
         CONCAT44(fVar21 * 0.0 + fVar19 * fVar24 + fVar18 * 0.0 + fVar15,
                  fVar20 * 0.0 + fVar19 * fVar23 + fVar17 * 0.0 + fVar14);
    fVar28 = fVar1 * 0.0;
    __return_storage_ptr__->M[6] = fVar26 * 0.0 + fVar19 * fVar25 + fVar16 * 0.0 + fVar28;
    fVar27 = fVar5 * 0.0;
    __return_storage_ptr__->M[7] = fVar4 * 0.0 + fVar19 * fVar22 + fVar27 + 0.0;
    fVar22 = fVar22 * 0.0;
    *(ulong *)__return_storage_ptr__->M =
         CONCAT44(fVar2 * fVar21 + fVar24 * 0.0 + fVar18 * 0.0 + fVar15,
                  fVar2 * fVar20 + fVar23 * 0.0 + fVar17 * 0.0 + fVar14);
    fVar19 = fVar4 * 0.0 + fVar22;
    fVar20 = fVar20 * 0.0 + fVar23 * 0.0;
    fVar21 = fVar21 * 0.0 + fVar24 * 0.0;
    fVar23 = fVar26 * 0.0 + fVar25 * 0.0;
    __return_storage_ptr__->M[2] = fVar26 * fVar2 + fVar25 * 0.0 + fVar16 * 0.0 + fVar28;
    __return_storage_ptr__->M[3] = fVar2 * fVar4 + fVar22 + fVar27 + 0.0;
    *(ulong *)(__return_storage_ptr__->M + 8) =
         CONCAT44(fVar3 * fVar18 + fVar21 + fVar15,fVar3 * fVar17 + fVar20 + fVar14);
    __return_storage_ptr__->M[10] = fVar23 + fVar16 * fVar3 + fVar28;
    __return_storage_ptr__->M[0xb] = fVar5 * fVar6 + fVar19 + 0.0;
    __return_storage_ptr__->M[0xc] = (float)(undefined4)uVar7 + fVar17 * 0.0 + fVar20;
    __return_storage_ptr__->M[0xd] = (float)uVar7._4_4_ + fVar18 * 0.0 + fVar21;
    __return_storage_ptr__->M[0xe] = fVar1 + fVar16 * 0.0 + fVar23;
    __return_storage_ptr__->M[0xf] = fVar19 + fVar27 + 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual core::matrix4 getRelativeTransformation() const
	{
		core::matrix4 mat;
		mat.setRotationDegrees(RelativeRotation);
		mat.setTranslation(RelativeTranslation);

		if (RelativeScale != core::vector3df(1.f, 1.f, 1.f)) {
			core::matrix4 smat;
			smat.setScale(RelativeScale);
			mat *= smat;
		}

		return mat;
	}